

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis.cpp
# Opt level: O2

QpVector * __thiscall
Basis::btran(Basis *this,QpVector *rhs,QpVector *target,bool buffer,HighsInt p)

{
  pointer piVar1;
  pointer pdVar2;
  HVector *pHVar3;
  QpVector *pQVar4;
  long lVar5;
  HVector rhs_hvec;
  HVectorBase<double> HStack_d8;
  
  pHVar3 = vec2hvec(this,rhs);
  HVectorBase<double>::HVectorBase(&HStack_d8,pHVar3);
  HFactor::btranCall(&this->basisfactor,&HStack_d8,1.0,(HighsTimerClock *)0x0);
  if (buffer) {
    HVectorBase<double>::copy<double>(&this->row_ep,&HStack_d8);
    piVar1 = (this->row_ep).packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar2 = (this->row_ep).packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (lVar5 = 0; lVar5 < HStack_d8.packCount; lVar5 = lVar5 + 1) {
      piVar1[lVar5] =
           HStack_d8.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[lVar5];
      pdVar2[lVar5] =
           HStack_d8.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[lVar5];
    }
    (this->row_ep).packCount = HStack_d8.packCount;
    (this->row_ep).packFlag = HStack_d8.packFlag;
    this->buffered_q = p;
  }
  pQVar4 = hvec2vec(this,&HStack_d8,target);
  HVectorBase<double>::~HVectorBase(&HStack_d8);
  return pQVar4;
}

Assistant:

QpVector& Basis::btran(const QpVector& rhs, QpVector& target, bool buffer,
                       HighsInt p) {
  HVector rhs_hvec = vec2hvec(rhs);
  basisfactor.btranCall(rhs_hvec, 1.0);
  if (buffer) {
    row_ep.copy(&rhs_hvec);
    for (HighsInt i = 0; i < rhs_hvec.packCount; i++) {
      row_ep.packIndex[i] = rhs_hvec.packIndex[i];
      row_ep.packValue[i] = rhs_hvec.packValue[i];
    }
    row_ep.packCount = rhs_hvec.packCount;
    row_ep.packFlag = rhs_hvec.packFlag;
    buffered_q = p;
  }
  return hvec2vec(rhs_hvec, target);
}